

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle.cpp
# Opt level: O2

void __thiscall QFusionStylePrivate::QFusionStylePrivate(QFusionStylePrivate *this)

{
  QCommonStylePrivate::QCommonStylePrivate(&this->super_QCommonStylePrivate);
  *(undefined ***)&(this->super_QCommonStylePrivate).super_QStylePrivate =
       &PTR__QCommonStylePrivate_007c7578;
  (this->super_QCommonStylePrivate).animationFps = 0x3c;
  return;
}

Assistant:

QFusionStylePrivate::QFusionStylePrivate()
{
    animationFps = 60;
}